

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# requantize.cpp
# Opt level: O0

int __thiscall ncnn::Requantize::load_param(Requantize *this,ParamDict *pd)

{
  int iVar1;
  ParamDict *in_RSI;
  Mat *in_RDI;
  int id;
  int def;
  Mat *this_00;
  int in_stack_ffffffffffffff54;
  ParamDict *in_stack_ffffffffffffff58;
  Mat local_a0 [2];
  ParamDict *local_10;
  
  def = 0;
  id = 1;
  local_10 = in_RSI;
  iVar1 = ParamDict::get(in_RSI,0,1);
  *(int *)&in_RDI[2].cstep = iVar1;
  iVar1 = ParamDict::get(local_10,id,id);
  *(int *)((long)&in_RDI[2].cstep + 4) = iVar1;
  iVar1 = ParamDict::get(local_10,2,def);
  *(int *)&in_RDI[3].data = iVar1;
  iVar1 = ParamDict::get(local_10,3,def);
  *(int *)((long)&in_RDI[3].data + 4) = iVar1;
  this_00 = local_a0;
  ncnn::Mat::Mat(this_00);
  ParamDict::get(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,this_00);
  ncnn::Mat::operator=(in_RDI,(Mat *)CONCAT44(def,id));
  ncnn::Mat::~Mat((Mat *)0x713fa5);
  ncnn::Mat::~Mat((Mat *)0x713faf);
  return 0;
}

Assistant:

int Requantize::load_param(const ParamDict& pd)
{
    //     scale_in = pd.get(0, 1.f);  // bottom_blob_scale * weight_scale
    //     scale_out = pd.get(1, 1.f); // top_blob_scale
    //     bias_term = pd.get(2, 0);
    //     bias_data_size = pd.get(3, 0);

    scale_in_data_size = pd.get(0, 1);
    scale_out_data_size = pd.get(1, 1);
    bias_data_size = pd.get(2, 0);
    activation_type = pd.get(3, 0);
    activation_params = pd.get(4, Mat());

    return 0;
}